

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O0

int ddGroupSiftingBackward(DdManager *table,Move *moves,int size,int upFlag,int lazyFlag)

{
  uint uVar1;
  int *piVar2;
  Move *pMVar3;
  int iVar4;
  uint local_70;
  uint local_6c;
  int local_5c;
  uint pairlev;
  int index;
  int tmp_diff;
  int diff;
  Move *end_move;
  Move *pMStack_38;
  int res;
  Move *move;
  int lazyFlag_local;
  int upFlag_local;
  int size_local;
  Move *moves_local;
  DdManager *table_local;
  
  _tmp_diff = (Move *)0x0;
  pMStack_38 = moves;
  lazyFlag_local = size;
  if (lazyFlag == 0) {
    for (; pMVar3 = moves, pMStack_38 != (Move *)0x0; pMStack_38 = pMStack_38->next) {
      if (pMStack_38->size < lazyFlag_local) {
        lazyFlag_local = pMStack_38->size;
      }
    }
  }
  else {
    _tmp_diff = (Move *)0x0;
    for (; pMStack_38 != (Move *)0x0; pMStack_38 = pMStack_38->next) {
      if (pMStack_38->size < lazyFlag_local) {
        lazyFlag_local = pMStack_38->size;
        _tmp_diff = pMStack_38;
      }
      else if ((pMStack_38->size == lazyFlag_local) && (_tmp_diff == (Move *)0x0)) {
        _tmp_diff = pMStack_38;
      }
    }
    pMVar3 = moves;
    if (moves != (Move *)0x0) {
      iVar4 = Cudd_ReadSize(table);
      index = iVar4 + 1;
      if (upFlag == 1) {
        local_5c = table->invperm[moves->x];
      }
      else {
        local_5c = table->invperm[moves->y];
      }
      piVar2 = table->perm;
      iVar4 = Cudd_bddReadPairIndex(table,local_5c);
      uVar1 = piVar2[iVar4];
      for (pMStack_38 = moves; pMVar3 = moves, pMStack_38 != (Move *)0x0;
          pMStack_38 = pMStack_38->next) {
        if (pMStack_38->size == lazyFlag_local) {
          if (upFlag == 1) {
            if (uVar1 < pMStack_38->x) {
              local_6c = pMStack_38->x - uVar1;
            }
            else {
              local_6c = uVar1 - pMStack_38->x;
            }
            pairlev = local_6c;
          }
          else {
            if (uVar1 < pMStack_38->y) {
              local_70 = pMStack_38->y - uVar1;
            }
            else {
              local_70 = uVar1 - pMStack_38->y;
            }
            pairlev = local_70;
          }
          if ((int)pairlev < index) {
            index = pairlev;
            _tmp_diff = pMStack_38;
          }
        }
      }
    }
  }
  do {
    pMStack_38 = pMVar3;
    if (pMStack_38 == (Move *)0x0) {
      return 1;
    }
    if (lazyFlag == 0) {
      if (pMStack_38->size == lazyFlag_local) {
        return 1;
      }
    }
    else if (pMStack_38 == _tmp_diff) {
      return 1;
    }
    if ((table->subtables[pMStack_38->x].next == pMStack_38->x) &&
       (table->subtables[pMStack_38->y].next == pMStack_38->y)) {
      iVar4 = cuddSwapInPlace(table,pMStack_38->x,pMStack_38->y);
      if (iVar4 == 0) {
        return 0;
      }
    }
    else if (pMStack_38->flags == 8) {
      ddDissolveGroup(table,pMStack_38->x,pMStack_38->y);
    }
    else {
      iVar4 = ddGroupMoveBackward(table,pMStack_38->x,pMStack_38->y);
      if (iVar4 == 0) {
        return 0;
      }
    }
    pMVar3 = pMStack_38->next;
  } while( true );
}

Assistant:

static int
ddGroupSiftingBackward(
  DdManager * table,
  Move * moves,
  int  size,
  int  upFlag,
  int  lazyFlag)
{
    Move *move;
    int  res;
    Move *end_move = NULL;
    int diff, tmp_diff;
    int index;
    unsigned int pairlev;

    if (lazyFlag) {
        end_move = NULL;

        /* Find the minimum size, and the earliest position at which it
        ** was achieved. */
        for (move = moves; move != NULL; move = move->next) {
            if (move->size < size) {
                size = move->size;
                end_move = move;
            } else if (move->size == size) {
                if (end_move == NULL) end_move = move;
            }
        }

        /* Find among the moves that give minimum size the one that
        ** minimizes the distance from the corresponding variable. */
        if (moves != NULL) {
            diff = Cudd_ReadSize(table) + 1;
            index = (upFlag == 1) ?
                    table->invperm[moves->x] : table->invperm[moves->y];
            pairlev =
                (unsigned) table->perm[Cudd_bddReadPairIndex(table, index)];

            for (move = moves; move != NULL; move = move->next) {
                if (move->size == size) {
                    if (upFlag == 1) {
                        tmp_diff = (move->x > pairlev) ?
                                    move->x - pairlev : pairlev - move->x;
                    } else {
                        tmp_diff = (move->y > pairlev) ?
                                    move->y - pairlev : pairlev - move->y;
                    }
                    if (tmp_diff < diff) {
                        diff = tmp_diff;
                        end_move = move;
                    }
                }
            }
        }
    } else {
        /* Find the minimum size. */
        for (move = moves; move != NULL; move = move->next) {
            if (move->size < size) {
                size = move->size;
            }
        }
    }

    /* In case of lazy sifting, end_move identifies the position at
    ** which we want to stop.  Otherwise, we stop as soon as we meet
    ** the minimum size. */
    for (move = moves; move != NULL; move = move->next) {
        if (lazyFlag) {
            if (move == end_move) return(1);
        } else {
            if (move->size == size) return(1);
        }
        if ((table->subtables[move->x].next == move->x) &&
        (table->subtables[move->y].next == move->y)) {
            res = cuddSwapInPlace(table,(int)move->x,(int)move->y);
            if (!res) return(0);
#ifdef DD_DEBUG
            if (pr > 0) (void) fprintf(table->out,"ddGroupSiftingBackward:\n");
            assert(table->subtables[move->x].next == move->x);
            assert(table->subtables[move->y].next == move->y);
#endif
        } else { /* Group move necessary */
            if (move->flags == MTR_NEWNODE) {
                ddDissolveGroup(table,(int)move->x,(int)move->y);
            } else {
                res = ddGroupMoveBackward(table,(int)move->x,(int)move->y);
                if (!res) return(0);
            }
        }

    }

    return(1);

}